

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

_Bool GPU_GetFullscreen(void)

{
  undefined8 uVar1;
  ulong uVar2;
  
  if ((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
     (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) {
    uVar1 = SDL_GetWindowFromID(_gpu_current_renderer->current_context_target->context->windowID);
    uVar2 = SDL_GetWindowFlags(uVar1);
    return (uVar2 & 0x1001) != 0;
  }
  return false;
}

Assistant:

GPU_bool GPU_GetFullscreen(void)
{
#ifdef SDL_GPU_USE_SDL2
    GPU_Target* target = GPU_GetContextTarget();
    if(target == NULL)
        return GPU_FALSE;
    return (SDL_GetWindowFlags(SDL_GetWindowFromID(target->context->windowID))
                   & (SDL_WINDOW_FULLSCREEN | SDL_WINDOW_FULLSCREEN_DESKTOP)) != 0;
#else
    SDL_Surface* surf = SDL_GetVideoSurface();
    if(surf == NULL)
        return GPU_FALSE;
    return (surf->flags & SDL_FULLSCREEN) != 0;
#endif
}